

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet++.cpp
# Opt level: O0

bool __thiscall
jsonnet::Jsonnet::evaluateFileMulti
          (Jsonnet *this,string *filename,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *outputs)

{
  char *str;
  long in_RDX;
  size_t in_RDI;
  char *unaff_retaddr;
  JsonnetVm *in_stack_00000008;
  char *jsonnet_output;
  int error;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar1;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  if (in_RDX == 0) {
    bVar2 = false;
  }
  else {
    iVar1 = 0;
    std::__cxx11::string::c_str();
    str = jsonnet_evaluate_file_multi
                    (in_stack_00000008,unaff_retaddr,
                     (int *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
    if (iVar1 == 0) {
      anon_unknown_1::parseMultiOutput
                (unaff_retaddr,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      jsonnet_realloc((JsonnetVm *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),str,in_RDI);
      bVar2 = true;
    }
    else {
      std::__cxx11::string::assign((char *)(in_RDI + 8));
      jsonnet_realloc((JsonnetVm *)CONCAT44(iVar1,in_stack_ffffffffffffffd8),str,in_RDI);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool Jsonnet::evaluateFileMulti(const std::string& filename,
                                std::map<std::string, std::string>* outputs)
{
    if (outputs == nullptr) {
        return false;
    }
    int error = 0;
    char* jsonnet_output = ::jsonnet_evaluate_file_multi(vm_, filename.c_str(), &error);
    if (error != 0) {
        last_error_.assign(jsonnet_output);
        jsonnet_realloc(vm_, jsonnet_output, 0);
        return false;
    }
    parseMultiOutput(jsonnet_output, outputs);
    jsonnet_realloc(vm_, jsonnet_output, 0);
    return true;
}